

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::setupRenderState(FlushFinishCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  deBool dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  TestError *this_00;
  int viewportH;
  int viewportW;
  int posLoc;
  Functions *gl;
  FlushFinishCase *this_local;
  long lVar8;
  
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar8 + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  iVar2 = (*pcVar1)(dVar3,"a_position");
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getWidth(pRVar9);
  iVar4 = de::min<int>(iVar4,0x80);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getHeight(pRVar9);
  iVar5 = de::min<int>(iVar5,0x80);
  while( true ) {
    dVar6 = ::deGetFalse();
    if ((dVar6 != 0) || (iVar2 < 0)) break;
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      (**(code **)(lVar8 + 0x1a00))(0,0,iVar4,iVar5);
      pcVar1 = *(code **)(lVar8 + 0x1680);
      dVar3 = glu::ShaderProgram::getProgram(this->m_program);
      (*pcVar1)(dVar3);
      (**(code **)(lVar8 + 0x610))(iVar2);
      (**(code **)(lVar8 + 0x19f0))(iVar2,2,0x1406,0,0,setupRenderState::s_positions);
      (**(code **)(lVar8 + 0x5e0))(0xbe2);
      (**(code **)(lVar8 + 0x120))(1);
      (**(code **)(lVar8 + 0x100))(0x8006);
      dVar3 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar3,"Failed to set up render state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
                      ,0xf2);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
             ,0xe9);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FlushFinishCase::setupRenderState (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				posLoc			= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				viewportW		= de::min<int>(m_context.getRenderTarget().getWidth(), MAX_VIEWPORT_SIZE);
	const int				viewportH		= de::min<int>(m_context.getRenderTarget().getHeight(), MAX_VIEWPORT_SIZE);

	static const float s_positions[] =
	{
		-1.0f, -1.0f,
		+1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, +1.0f
	};

	TCU_CHECK(posLoc >= 0);

	gl.viewport(0, 0, viewportW, viewportH);
	gl.useProgram(m_program->getProgram());
	gl.enableVertexAttribArray(posLoc);
	gl.vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, &s_positions[0]);
	gl.enable(GL_BLEND);
	gl.blendFunc(GL_ONE, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set up render state");
}